

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O0

double __thiscall lts2::LBDOperator::measureAtCell(LBDOperator *this,int cellIndex)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  undefined4 y;
  undefined4 uVar6;
  undefined4 y_00;
  double dVar5;
  IntegratingCell *pIVar7;
  double *pdVar8;
  double D;
  double C;
  double B;
  double A;
  IntegratingCell cell;
  double measure;
  int cellIndex_local;
  LBDOperator *this_local;
  
  pIVar7 = this->_sensitiveCells + cellIndex;
  uVar4 = pIVar7->xmin;
  uVar6 = pIVar7->xmax;
  y = pIVar7->ymin;
  y_00 = pIVar7->ymax;
  dVar5 = pIVar7->scaleFactor;
  pdVar8 = cv::Mat::ptr<double>(&this->_integralImage,y);
  dVar1 = pdVar8[(int)uVar4];
  pdVar8 = cv::Mat::ptr<double>(&this->_integralImage,y);
  dVar2 = pdVar8[(int)uVar6];
  pdVar8 = cv::Mat::ptr<double>(&this->_integralImage,y_00);
  dVar3 = pdVar8[(int)uVar4];
  pdVar8 = cv::Mat::ptr<double>(&this->_integralImage,y_00);
  return dVar5 * (((pdVar8[(int)uVar6] + dVar1) - dVar2) - dVar3);
}

Assistant:

double lts2::LBDOperator::measureAtCell(int cellIndex) const
{
    double measure = 0.0;
    
    lbd::IntegratingCell cell = _sensitiveCells[cellIndex];

    double A, B, C, D;
    
    A = *(_integralImage.ptr<double>(cell.ymin) + cell.xmin);
    B = *(_integralImage.ptr<double>(cell.ymin) + cell.xmax);
    C = *(_integralImage.ptr<double>(cell.ymax) + cell.xmin);
    D = *(_integralImage.ptr<double>(cell.ymax) + cell.xmax);
    
    measure = cell.scaleFactor * (D + A - B - C);
    
    return measure;
}